

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastSet.h
# Opt level: O0

CFastSet<unsigned_int> * __thiscall
CFastSet<unsigned_int>::operator*=(CFastSet<unsigned_int> *this,CFastSet<unsigned_int> *set)

{
  size_t *psVar1;
  iterator __first1;
  iterator __last1;
  iterator __first2;
  iterator __last2;
  iterator __i;
  insert_iterator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
  __result;
  undefined1 local_b8 [8];
  CSet result;
  CSet b;
  undefined1 local_48 [8];
  CSet a;
  CFastSet<unsigned_int> *set_local;
  CFastSet<unsigned_int> *this_local;
  
  a._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)set;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_48);
  GetSet(this,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_48)
  ;
  psVar1 = &result._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)psVar1);
  GetSet((CFastSet<unsigned_int> *)a._M_t._M_impl.super__Rb_tree_header._M_node_count,(CSet *)psVar1
        );
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_b8);
  __first1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                       ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *
                        )local_48);
  __last1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                      ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       local_48);
  psVar1 = &result._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __first2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                       ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *
                        )psVar1);
  __last2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                      ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       psVar1);
  __i = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                  ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                   local_b8);
  __result = std::
             inserter<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>
                       ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *
                        )local_b8,__i);
  std::
  set_intersection<std::_Rb_tree_const_iterator<unsigned_int>,std::_Rb_tree_const_iterator<unsigned_int>,std::insert_iterator<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>
            ((_Rb_tree_const_iterator<unsigned_int>)__first1._M_node,
             (_Rb_tree_const_iterator<unsigned_int>)__last1._M_node,
             (_Rb_tree_const_iterator<unsigned_int>)__first2._M_node,
             (_Rb_tree_const_iterator<unsigned_int>)__last2._M_node,__result);
  operator=(this,(CSet *)local_b8);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_b8);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &result._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_48);
  return this;
}

Assistant:

CFastSet<T>& CFastSet<T>::operator*=(const CFastSet& set)
{
	CSet a;
	GetSet( &a );
	CSet b;
	set.GetSet( &b );
	CSet result;

	std::set_intersection( a.begin(), a.end(), b.begin(), b.end(),
		std::inserter( result, result.end() ) );

	*this = result;

	return *this;
}